

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  double a;
  char cVar1;
  pointer pnVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  bool *pbVar8;
  ulong *puVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  ulong *puVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  byte bVar18;
  ulong uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_778;
  cpp_dec_float<200U,_int,_void> local_6f8;
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [13];
  undefined3 uStack_60b;
  int iStack_608;
  bool abStack_604 [4];
  ulong local_600;
  undefined1 local_5f8 [32];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [13];
  undefined3 uStack_58b;
  undefined5 uStack_588;
  undefined8 local_580;
  undefined1 local_578 [32];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [13];
  undefined3 uStack_50b;
  int iStack_508;
  bool abStack_504 [4];
  ulong local_500;
  cpp_dec_float<200U,_int,_void> local_4f8;
  cpp_dec_float<200U,_int,_void> local_478;
  cpp_dec_float<200U,_int,_void> local_3f8;
  cpp_dec_float<200U,_int,_void> local_378;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [13];
  undefined3 uStack_28b;
  int iStack_288;
  bool abStack_284 [4];
  ulong local_280;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_270;
  uint local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar18 = 0;
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  local_280 = 0x1c00000000;
  local_2f8._0_16_ = (undefined1  [16])0x0;
  local_2f8._16_16_ = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = SUB1613((undefined1  [16])0x0,0);
  uStack_28b = 0;
  iStack_288 = 0;
  abStack_284[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_2f8,a);
  local_378.fpclass = cpp_dec_float_finite;
  local_378.prec_elem = 0x1c;
  local_378.data._M_elems[0] = 0;
  local_378.data._M_elems[1] = 0;
  local_378.data._M_elems[2] = 0;
  local_378.data._M_elems[3] = 0;
  local_378.data._M_elems[4] = 0;
  local_378.data._M_elems[5] = 0;
  local_378.data._M_elems[6] = 0;
  local_378.data._M_elems[7] = 0;
  local_378.data._M_elems[8] = 0;
  local_378.data._M_elems[9] = 0;
  local_378.data._M_elems[10] = 0;
  local_378.data._M_elems[0xb] = 0;
  local_378.data._M_elems[0xc] = 0;
  local_378.data._M_elems[0xd] = 0;
  local_378.data._M_elems[0xe] = 0;
  local_378.data._M_elems[0xf] = 0;
  local_378.data._M_elems[0x10] = 0;
  local_378.data._M_elems[0x11] = 0;
  local_378.data._M_elems[0x12] = 0;
  local_378.data._M_elems[0x13] = 0;
  local_378.data._M_elems[0x14] = 0;
  local_378.data._M_elems[0x15] = 0;
  local_378.data._M_elems[0x16] = 0;
  local_378.data._M_elems[0x17] = 0;
  local_378.data._M_elems[0x18] = 0;
  local_378.data._M_elems[0x19] = 0;
  local_378.data._M_elems._104_5_ = 0;
  local_378.data._M_elems[0x1b]._1_3_ = 0;
  local_378.exp = 0;
  local_378.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_378,0.0);
  ::soplex::infinity::__tls_init();
  local_3f8.fpclass = cpp_dec_float_finite;
  local_3f8.prec_elem = 0x1c;
  local_3f8.data._M_elems[0] = 0;
  local_3f8.data._M_elems[1] = 0;
  local_3f8.data._M_elems[2] = 0;
  local_3f8.data._M_elems[3] = 0;
  local_3f8.data._M_elems[4] = 0;
  local_3f8.data._M_elems[5] = 0;
  local_3f8.data._M_elems[6] = 0;
  local_3f8.data._M_elems[7] = 0;
  local_3f8.data._M_elems[8] = 0;
  local_3f8.data._M_elems[9] = 0;
  local_3f8.data._M_elems[10] = 0;
  local_3f8.data._M_elems[0xb] = 0;
  local_3f8.data._M_elems[0xc] = 0;
  local_3f8.data._M_elems[0xd] = 0;
  local_3f8.data._M_elems[0xe] = 0;
  local_3f8.data._M_elems[0xf] = 0;
  local_3f8.data._M_elems[0x10] = 0;
  local_3f8.data._M_elems[0x11] = 0;
  local_3f8.data._M_elems[0x12] = 0;
  local_3f8.data._M_elems[0x13] = 0;
  local_3f8.data._M_elems[0x14] = 0;
  local_3f8.data._M_elems[0x15] = 0;
  local_3f8.data._M_elems[0x16] = 0;
  local_3f8.data._M_elems[0x17] = 0;
  local_3f8.data._M_elems[0x18] = 0;
  local_3f8.data._M_elems[0x19] = 0;
  local_3f8.data._M_elems._104_5_ = 0;
  local_3f8.data._M_elems[0x1b]._1_3_ = 0;
  local_3f8.exp = 0;
  local_3f8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_3f8,a);
  local_478.fpclass = cpp_dec_float_finite;
  local_478.prec_elem = 0x1c;
  local_478.data._M_elems[0] = 0;
  local_478.data._M_elems[1] = 0;
  local_478.data._M_elems[2] = 0;
  local_478.data._M_elems[3] = 0;
  local_478.data._M_elems[4] = 0;
  local_478.data._M_elems[5] = 0;
  local_478.data._M_elems[6] = 0;
  local_478.data._M_elems[7] = 0;
  local_478.data._M_elems[8] = 0;
  local_478.data._M_elems[9] = 0;
  local_478.data._M_elems[10] = 0;
  local_478.data._M_elems[0xb] = 0;
  local_478.data._M_elems[0xc] = 0;
  local_478.data._M_elems[0xd] = 0;
  local_478.data._M_elems[0xe] = 0;
  local_478.data._M_elems[0xf] = 0;
  local_478.data._M_elems[0x10] = 0;
  local_478.data._M_elems[0x11] = 0;
  local_478.data._M_elems[0x12] = 0;
  local_478.data._M_elems[0x13] = 0;
  local_478.data._M_elems[0x14] = 0;
  local_478.data._M_elems[0x15] = 0;
  local_478.data._M_elems[0x16] = 0;
  local_478.data._M_elems[0x17] = 0;
  local_478.data._M_elems[0x18] = 0;
  local_478.data._M_elems[0x19] = 0;
  local_478.data._M_elems._104_5_ = 0;
  local_478.data._M_elems[0x1b]._1_3_ = 0;
  local_478.exp = 0;
  local_478.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_478,0.0);
  ::soplex::infinity::__tls_init();
  local_4f8.fpclass = cpp_dec_float_finite;
  local_4f8.prec_elem = 0x1c;
  local_4f8.data._M_elems[0] = 0;
  local_4f8.data._M_elems[1] = 0;
  local_4f8.data._M_elems[2] = 0;
  local_4f8.data._M_elems[3] = 0;
  local_4f8.data._M_elems[4] = 0;
  local_4f8.data._M_elems[5] = 0;
  local_4f8.data._M_elems[6] = 0;
  local_4f8.data._M_elems[7] = 0;
  local_4f8.data._M_elems[8] = 0;
  local_4f8.data._M_elems[9] = 0;
  local_4f8.data._M_elems[10] = 0;
  local_4f8.data._M_elems[0xb] = 0;
  local_4f8.data._M_elems[0xc] = 0;
  local_4f8.data._M_elems[0xd] = 0;
  local_4f8.data._M_elems[0xe] = 0;
  local_4f8.data._M_elems[0xf] = 0;
  local_4f8.data._M_elems[0x10] = 0;
  local_4f8.data._M_elems[0x11] = 0;
  local_4f8.data._M_elems[0x12] = 0;
  local_4f8.data._M_elems[0x13] = 0;
  local_4f8.data._M_elems[0x14] = 0;
  local_4f8.data._M_elems[0x15] = 0;
  local_4f8.data._M_elems[0x16] = 0;
  local_4f8.data._M_elems[0x17] = 0;
  local_4f8.data._M_elems[0x18] = 0;
  local_4f8.data._M_elems[0x19] = 0;
  local_4f8.data._M_elems._104_5_ = 0;
  local_4f8.data._M_elems[0x1b]._1_3_ = 0;
  local_4f8.exp = 0;
  local_4f8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_4f8,a);
  local_500 = 0x1c00000000;
  local_578._0_16_ = (undefined1  [16])0x0;
  local_578._16_16_ = (undefined1  [16])0x0;
  local_558 = (undefined1  [16])0x0;
  local_548 = (undefined1  [16])0x0;
  local_538 = (undefined1  [16])0x0;
  local_528 = (undefined1  [16])0x0;
  local_518 = SUB1613((undefined1  [16])0x0,0);
  uStack_50b = 0;
  iStack_508 = 0;
  abStack_504[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_578,0.0);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar15 = 0x78;
    lVar16 = 0;
    do {
      pnVar2 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (ulong *)((long)&(pnVar2->m_backend).data + lVar15);
      puVar9 = puVar12 + -0xf;
      puVar13 = local_a0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar13 = (uint)*puVar9;
        puVar9 = (ulong *)((long)puVar9 + (ulong)bVar18 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
      }
      uVar3 = puVar12[-1];
      cVar1 = *(char *)((long)puVar12 + -4);
      uVar19 = *puVar12;
      local_6f8.fpclass = cpp_dec_float_finite;
      local_6f8.prec_elem = 0x1c;
      local_6f8.neg = false;
      local_6f8.exp = 0;
      puVar13 = local_a0;
      pcVar11 = &local_6f8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_6f8.exp = (int)uVar3;
      local_6f8.neg = (bool)cVar1;
      local_6f8.fpclass = (int)uVar19;
      local_6f8.prec_elem = (int)(uVar19 >> 0x20);
      if ((cVar1 == '\x01') && ((int)uVar19 != 0 || local_6f8.data._M_elems[0] != 0)) {
        local_6f8.neg = false;
      }
      puVar12 = puVar12 + -0xf;
      puVar13 = local_110;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar13 = (uint)*puVar12;
        puVar12 = (ulong *)((long)puVar12 + (ulong)bVar18 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
      }
      iVar4 = *(int *)((long)&(pnVar2->m_backend).data + lVar15 + -8);
      cVar1 = *(char *)((long)&(pnVar2->m_backend).data + lVar15 + -4);
      uVar19 = *(ulong *)((long)&(pnVar2->m_backend).data + lVar15);
      local_778.fpclass = cpp_dec_float_finite;
      local_778.prec_elem = 0x1c;
      local_778.neg = false;
      local_778.exp = 0;
      puVar13 = local_110;
      pcVar11 = &local_778;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_778.neg = (bool)cVar1;
      if ((cVar1 == '\x01') && ((int)uVar19 != 0 || local_778.data._M_elems[0] != 0)) {
        local_778.neg = false;
      }
      local_778.exp = iVar4;
      local_778._120_8_ = uVar19;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj(&local_270,
            &this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)lVar16);
      local_600._0_4_ = cpp_dec_float_finite;
      local_600._4_4_ = 0x1c;
      abStack_604[0] = false;
      iStack_608 = 0;
      pnVar10 = &local_270;
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_678;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
      }
      iStack_608 = local_270.m_backend.exp;
      abStack_604[0] = local_270.m_backend.neg;
      local_600._0_4_ = local_270.m_backend.fpclass;
      local_600._4_4_ = local_270.m_backend.prec_elem;
      if ((local_270.m_backend.neg == true) &&
         (local_270.m_backend.fpclass != 0 || local_678._0_4_ != 0)) {
        abStack_604[0] = false;
      }
      ::soplex::infinity::__tls_init();
      local_580._0_4_ = cpp_dec_float_finite;
      local_580._4_4_ = 0x1c;
      local_5f8._0_16_ = (undefined1  [16])0x0;
      local_5f8._16_16_ = (undefined1  [16])0x0;
      local_5d8 = (undefined1  [16])0x0;
      local_5c8 = (undefined1  [16])0x0;
      local_5b8 = (undefined1  [16])0x0;
      local_5a8 = (undefined1  [16])0x0;
      local_598 = SUB1613((undefined1  [16])0x0,0);
      uStack_58b = 0;
      uStack_588._0_4_ = 0;
      uStack_588._4_1_ = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_5f8,a);
      if (((local_6f8.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_580 != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_6f8,(cpp_dec_float<200U,_int,_void> *)local_5f8), iVar4 < 0)) {
        uVar5 = 0;
        if ((local_3f8.fpclass != cpp_dec_float_NaN) && (local_6f8.fpclass != cpp_dec_float_NaN)) {
          uVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_3f8,&local_6f8);
          uVar5 = uVar5 >> 0x1f;
        }
        bVar17 = (char)uVar5 != '\0';
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_3f8;
        }
        pcVar14 = &local_3f8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_3f8;
        }
        local_3f8.exp = pcVar11->exp;
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_3f8;
        }
        local_3f8.neg = pcVar11->neg;
        uVar19 = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
        uVar19 = ~uVar19 & local_6f8._120_8_ | local_3f8._120_8_ & uVar19;
        local_3f8.fpclass = (int)uVar19;
        local_3f8.prec_elem = (int)(uVar19 >> 0x20);
        bVar17 = false;
        if ((local_478.fpclass != cpp_dec_float_NaN) && (local_6f8.fpclass != cpp_dec_float_NaN)) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_478,&local_6f8);
          bVar17 = 0 < iVar4;
        }
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_478;
        }
        pcVar14 = &local_478;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_478;
        }
        local_478.exp = pcVar11->exp;
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_478;
        }
        local_478.neg = pcVar11->neg;
        uVar19 = CONCAT44((int)((uint)bVar17 << 0x1f) >> 0x1f,(int)((uint)bVar17 << 0x1f) >> 0x1f);
        local_478._120_8_ = ~uVar19 & local_6f8._120_8_ | local_478._120_8_ & uVar19;
      }
      ::soplex::infinity::__tls_init();
      local_580._0_4_ = cpp_dec_float_finite;
      local_580._4_4_ = 0x1c;
      local_5f8._0_16_ = (undefined1  [16])0x0;
      local_5f8._16_16_ = (undefined1  [16])0x0;
      local_5d8 = (undefined1  [16])0x0;
      local_5c8 = (undefined1  [16])0x0;
      local_5b8 = (undefined1  [16])0x0;
      local_5a8 = (undefined1  [16])0x0;
      local_598 = SUB1613((undefined1  [16])0x0,0);
      uStack_58b = 0;
      uStack_588._0_4_ = 0;
      uStack_588._4_1_ = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_5f8,a);
      if (((local_778.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_580 != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_778,(cpp_dec_float<200U,_int,_void> *)local_5f8), iVar4 < 0)) {
        uVar5 = 0;
        if ((local_3f8.fpclass != cpp_dec_float_NaN) &&
           (uVar5 = 0, local_778.fpclass != cpp_dec_float_NaN)) {
          uVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_3f8,&local_778);
          uVar5 = uVar5 >> 0x1f;
        }
        bVar17 = (char)uVar5 != '\0';
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_3f8;
        }
        pcVar14 = &local_3f8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_3f8;
        }
        local_3f8.exp = pcVar11->exp;
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_3f8;
        }
        local_3f8.neg = pcVar11->neg;
        uVar19 = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
        uVar19 = ~uVar19 & local_778._120_8_ | local_3f8._120_8_ & uVar19;
        local_3f8.fpclass = (int)uVar19;
        local_3f8.prec_elem = (int)(uVar19 >> 0x20);
        bVar17 = false;
        if ((local_478.fpclass != cpp_dec_float_NaN) && (local_778.fpclass != cpp_dec_float_NaN)) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_478,&local_778);
          bVar17 = 0 < iVar4;
        }
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_478;
        }
        pcVar14 = &local_478;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_478;
        }
        local_478.exp = pcVar11->exp;
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_478;
        }
        local_478.neg = pcVar11->neg;
        uVar19 = CONCAT44((int)((uint)bVar17 << 0x1f) >> 0x1f,(int)((uint)bVar17 << 0x1f) >> 0x1f);
        uVar19 = ~uVar19 & local_778._120_8_ | local_478._120_8_ & uVar19;
        local_478.fpclass = (int)uVar19;
        local_478.prec_elem = (int)(uVar19 >> 0x20);
      }
      uVar5 = 0;
      if (((fpclass_type)local_280 != cpp_dec_float_NaN) &&
         (uVar5 = 0, (fpclass_type)local_600 != cpp_dec_float_NaN)) {
        uVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                           (cpp_dec_float<200U,_int,_void> *)local_678);
        uVar5 = uVar5 >> 0x1f;
      }
      bVar17 = (char)uVar5 != '\0';
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_678;
      if (bVar17) {
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
      }
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
      }
      piVar7 = &iStack_608;
      if (bVar17) {
        piVar7 = &iStack_288;
      }
      iStack_288 = *piVar7;
      pbVar8 = abStack_604;
      if (bVar17) {
        pbVar8 = abStack_284;
      }
      abStack_284[0] = *pbVar8;
      uVar19 = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
      local_280 = ~uVar19 & local_600 | local_280 & uVar19;
      bVar17 = false;
      if ((local_378.fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_600 != cpp_dec_float_NaN)
         ) {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_378,(cpp_dec_float<200U,_int,_void> *)local_678);
        bVar17 = 0 < iVar4;
      }
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_678;
      if (bVar17) {
        pcVar11 = &local_378;
      }
      pcVar14 = &local_378;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
      }
      piVar7 = &iStack_608;
      if (bVar17) {
        piVar7 = &local_378.exp;
      }
      local_378.exp = *piVar7;
      pbVar8 = abStack_604;
      if (bVar17) {
        pbVar8 = &local_378.neg;
      }
      local_378.neg = *pbVar8;
      uVar19 = CONCAT44((int)((uint)bVar17 << 0x1f) >> 0x1f,(int)((uint)bVar17 << 0x1f) >> 0x1f);
      uVar19 = ~uVar19 & local_600 | local_378._120_8_ & uVar19;
      local_378.fpclass = (int)uVar19;
      local_378.prec_elem = (int)(uVar19 >> 0x20);
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x80;
    } while (lVar16 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar15 = 0x78;
    lVar16 = 0;
    do {
      puVar9 = (ulong *)((long)&(((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .left.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                        lVar15);
      puVar12 = puVar9 + -0xf;
      puVar13 = local_180;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar13 = (uint)*puVar12;
        puVar12 = (ulong *)((long)puVar12 + (ulong)bVar18 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
      }
      uVar3 = puVar9[-1];
      cVar1 = *(char *)((long)puVar9 + -4);
      uVar19 = *puVar9;
      local_6f8.fpclass = cpp_dec_float_finite;
      local_6f8.prec_elem = 0x1c;
      local_6f8.neg = false;
      local_6f8.exp = 0;
      puVar13 = local_180;
      pcVar11 = &local_6f8;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
      }
      local_6f8.exp = (int)uVar3;
      local_6f8.neg = (bool)cVar1;
      local_6f8.fpclass = (int)uVar19;
      local_6f8.prec_elem = (int)(uVar19 >> 0x20);
      if ((cVar1 == '\x01') && ((int)uVar19 != 0 || local_6f8.data._M_elems[0] != 0)) {
        local_6f8.neg = false;
      }
      puVar9 = (ulong *)((long)&(((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .right.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                        lVar15);
      puVar12 = puVar9 + -0xf;
      puVar13 = local_1f0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar13 = (uint)*puVar12;
        puVar12 = (ulong *)((long)puVar12 + (ulong)bVar18 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
      }
      uVar3 = puVar9[-1];
      cVar1 = *(char *)((long)puVar9 + -4);
      uVar19 = *puVar9;
      local_778.fpclass = cpp_dec_float_finite;
      local_778.prec_elem = 0x1c;
      local_778.neg = false;
      local_778.exp = 0;
      puVar13 = local_1f0;
      pcVar11 = &local_778;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_778.neg = (bool)cVar1;
      if ((cVar1 == '\x01') && ((int)uVar19 != 0 || local_778.data._M_elems[0] != 0)) {
        local_778.neg = false;
      }
      local_778.exp = (int)uVar3;
      local_778._120_8_ = uVar19;
      ::soplex::infinity::__tls_init();
      local_600._0_4_ = cpp_dec_float_finite;
      local_600._4_4_ = 0x1c;
      local_678 = (undefined1  [16])0x0;
      local_668 = (undefined1  [16])0x0;
      local_658 = (undefined1  [16])0x0;
      local_648 = (undefined1  [16])0x0;
      local_638 = (undefined1  [16])0x0;
      local_628 = (undefined1  [16])0x0;
      local_618 = SUB1613((undefined1  [16])0x0,0);
      uStack_60b = 0;
      iStack_608 = 0;
      abStack_604[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_678,a);
      if (((local_6f8.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_600 != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_6f8,(cpp_dec_float<200U,_int,_void> *)local_678), 0 < iVar4)) {
        uVar5 = 0;
        if ((local_4f8.fpclass != cpp_dec_float_NaN) && (local_6f8.fpclass != cpp_dec_float_NaN)) {
          uVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_4f8,&local_6f8);
          uVar5 = uVar5 >> 0x1f;
        }
        bVar17 = (char)uVar5 != '\0';
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_4f8;
        }
        pcVar14 = &local_4f8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_4f8;
        }
        local_4f8.exp = pcVar11->exp;
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = &local_4f8;
        }
        local_4f8.neg = pcVar11->neg;
        uVar19 = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
        uVar19 = ~uVar19 & local_6f8._120_8_ | local_4f8._120_8_ & uVar19;
        local_4f8.fpclass = (int)uVar19;
        local_4f8.prec_elem = (int)(uVar19 >> 0x20);
        bVar17 = false;
        if (((fpclass_type)local_500 != cpp_dec_float_NaN) &&
           (local_6f8.fpclass != cpp_dec_float_NaN)) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_578,&local_6f8);
          bVar17 = 0 < iVar4;
        }
        pcVar11 = &local_6f8;
        if (bVar17) {
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_578;
        }
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_578;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        piVar7 = &local_6f8.exp;
        if (bVar17) {
          piVar7 = &iStack_508;
        }
        iStack_508 = *piVar7;
        pbVar8 = &local_6f8.neg;
        if (bVar17) {
          pbVar8 = abStack_504;
        }
        abStack_504[0] = *pbVar8;
        uVar19 = CONCAT44((int)((uint)bVar17 << 0x1f) >> 0x1f,(int)((uint)bVar17 << 0x1f) >> 0x1f);
        local_500 = ~uVar19 & local_6f8._120_8_ | local_500 & uVar19;
      }
      ::soplex::infinity::__tls_init();
      local_600 = 0x1c00000000;
      local_678 = (undefined1  [16])0x0;
      local_668 = (undefined1  [16])0x0;
      local_658 = (undefined1  [16])0x0;
      local_648 = (undefined1  [16])0x0;
      local_638 = (undefined1  [16])0x0;
      local_628 = (undefined1  [16])0x0;
      local_618 = SUB1613((undefined1  [16])0x0,0);
      uStack_60b = 0;
      iStack_608 = 0;
      abStack_604[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_678,a);
      if (((local_778.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_600 != cpp_dec_float_NaN)) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_778,(cpp_dec_float<200U,_int,_void> *)local_678), iVar4 < 0)) {
        uVar5 = 0;
        if ((local_4f8.fpclass != cpp_dec_float_NaN) && (local_778.fpclass != cpp_dec_float_NaN)) {
          uVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_4f8,&local_778);
          uVar5 = uVar5 >> 0x1f;
        }
        bVar17 = (char)uVar5 != '\0';
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_4f8;
        }
        pcVar14 = &local_4f8;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_4f8;
        }
        local_4f8.exp = pcVar11->exp;
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = &local_4f8;
        }
        local_4f8.neg = pcVar11->neg;
        uVar19 = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
        uVar19 = ~uVar19 & local_778._120_8_ | local_4f8._120_8_ & uVar19;
        local_4f8.fpclass = (int)uVar19;
        local_4f8.prec_elem = (int)(uVar19 >> 0x20);
        bVar17 = false;
        if (((fpclass_type)local_500 != cpp_dec_float_NaN) &&
           (local_778.fpclass != cpp_dec_float_NaN)) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_578,&local_778);
          bVar17 = 0 < iVar4;
        }
        pcVar11 = &local_778;
        if (bVar17) {
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_578;
        }
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_578;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar18 * -2 + 1) * 4)
          ;
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4)
          ;
        }
        piVar7 = &local_778.exp;
        if (bVar17) {
          piVar7 = &iStack_508;
        }
        iStack_508 = *piVar7;
        pbVar8 = &local_778.neg;
        if (bVar17) {
          pbVar8 = abStack_504;
        }
        abStack_504[0] = *pbVar8;
        uVar19 = CONCAT44((int)((uint)bVar17 << 0x1f) >> 0x1f,(int)((uint)bVar17 << 0x1f) >> 0x1f);
        local_500 = ~uVar19 & local_778._120_8_ | local_500 & uVar19;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x80;
    } while (lVar16 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_6f8.fpclass = cpp_dec_float_finite;
  local_6f8.prec_elem = 0x1c;
  local_6f8.exp = 0;
  local_6f8.neg = false;
  pcVar11 = &local_478;
  pcVar14 = &local_6f8;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
  }
  local_6f8.exp = local_478.exp;
  local_6f8.neg = local_478.neg;
  local_6f8.fpclass = local_478.fpclass;
  local_6f8.prec_elem = local_478.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_6f8,&local_3f8)
  ;
  pcVar11 = &local_6f8;
  pnVar10 = &this->boundrange;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + (ulong)bVar18 * -8 + 4);
  }
  (this->boundrange).m_backend.exp = local_6f8.exp;
  (this->boundrange).m_backend.neg = local_6f8.neg;
  (this->boundrange).m_backend.fpclass = local_6f8.fpclass;
  (this->boundrange).m_backend.prec_elem = local_6f8.prec_elem;
  local_6f8.fpclass = cpp_dec_float_finite;
  local_6f8.prec_elem = 0x1c;
  local_6f8.exp = 0;
  local_6f8.neg = false;
  puVar13 = (uint *)local_578;
  pcVar11 = &local_6f8;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar11->data)._M_elems[0] = *puVar13;
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
  }
  local_6f8.exp = iStack_508;
  local_6f8.neg = abStack_504[0];
  local_6f8.fpclass = (fpclass_type)local_500;
  local_6f8.prec_elem = local_500._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_6f8,&local_4f8)
  ;
  pcVar11 = &local_6f8;
  pnVar10 = &this->siderange;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + (ulong)bVar18 * -8 + 4);
  }
  (this->siderange).m_backend.exp = local_6f8.exp;
  (this->siderange).m_backend.neg = local_6f8.neg;
  (this->siderange).m_backend.fpclass = local_6f8.fpclass;
  (this->siderange).m_backend.prec_elem = local_6f8.prec_elem;
  local_6f8.fpclass = cpp_dec_float_finite;
  local_6f8.prec_elem = 0x1c;
  local_6f8.exp = 0;
  local_6f8.neg = false;
  pcVar11 = &local_378;
  pcVar14 = &local_6f8;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
  }
  local_6f8.exp = local_378.exp;
  local_6f8.neg = local_378.neg;
  local_6f8.fpclass = local_378.fpclass;
  local_6f8.prec_elem = local_378.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_6f8,(cpp_dec_float<200U,_int,_void> *)local_2f8);
  pcVar11 = &local_6f8;
  pnVar10 = &this->objrange;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar10->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
    pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar10 + (ulong)bVar18 * -8 + 4);
  }
  (this->objrange).m_backend.exp = local_6f8.exp;
  (this->objrange).m_backend.neg = local_6f8.neg;
  (this->objrange).m_backend.fpclass = local_6f8.fpclass;
  (this->objrange).m_backend.prec_elem = local_6f8.prec_elem;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}